

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

void __thiscall common::Options::Init(Options *this,int argc,char **argv)

{
  int iVar1;
  Log *this_00;
  allocator local_59;
  Options *local_58;
  string local_50;
  
  local_58 = this;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar1 = getopt(argc,argv,"l:f:c:");
          if (iVar1 != 99) break;
          std::__cxx11::string::assign((char *)&this->config_file);
        }
        if (iVar1 != 0x66) break;
        std::__cxx11::string::assign((char *)&this->log_file);
      }
      if (iVar1 != 0x6c) break;
      iVar1 = xlib::Atoi(_optarg);
      local_58->log_level = iVar1;
    }
  } while (iVar1 != -1);
  this_00 = xlib::Log::Instance();
  std::__cxx11::string::string((string *)&local_50,"optind %v",&local_59);
  xlib::Log::SWrite<int>
            (this_00,LOG_PRIORITY_DEBUG,
             "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/options.cc"
             ,0x3a,"Init",true,&local_50,(int *)&optind);
  std::__cxx11::string::~string((string *)&local_50);
  local_58->opt_cur = _optind;
  return;
}

Assistant:

void Options::Init(int argc, char **argv) {
    int opt  = 0;
    while ( -1 != (opt = getopt(argc, argv, "l:f:c:")) ) {
        switch (opt) {
            case 'l':
                log_level = xlib::Atoi(optarg);
                break;
            case 'f':
                log_file = optarg;
                break;
            case 'c':
                config_file = optarg;
                break;
        }
    }
    XDBG("optind %v", optind);
    opt_cur = optind;
}